

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::beta_dist<float>::icdf(beta_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 x_00;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      x_00 = param_type::alpha(in_RDI);
      param_type::beta(in_RDI);
      param_type::norm(in_RDI);
      local_4 = math::inv_Beta_I(x_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                                 in_stack_ffffffffffffffc8);
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return 1;
      return math::inv_Beta_I(x, P.alpha(), P.beta(), P.norm());
    }